

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O3

int nn_bipc_create(void *hint,nn_epbase **epbase)

{
  nn_usock *self;
  nn_ctx **self_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int iVar1;
  int extraout_EAX_05;
  uint uVar2;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  nn_fsm *pnVar3;
  nn_ctx *ctx;
  nn_list_item *pnVar4;
  nn_list_item *pnVar5;
  char *__s;
  size_t sVar6;
  nn_aipc *pnVar7;
  nn_aipc *in_RCX;
  uint *puVar8;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar9;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int extraout_EDX_03;
  nn_epbase **ppnVar10;
  nn_bipc *pnVar11;
  nn_fsm *self_01;
  nn_aipc *unaff_R15;
  int reconnect_ivl_max;
  int reconnect_ivl;
  sockaddr asStack_118 [6];
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  nn_fsm *pnStack_98;
  nn_aipc *pnStack_90;
  nn_aipc *pnStack_88;
  undefined1 local_30 [8];
  nn_fsm_fn local_28;
  
  pnVar11 = (nn_bipc *)0x3f0;
  ppnVar10 = epbase;
  pnVar3 = (nn_fsm *)nn_alloc_(0x3f0);
  iVar1 = (int)ppnVar10;
  if (pnVar3 == (nn_fsm *)0x0) {
    nn_bipc_create_cold_3();
LAB_0012a2de:
    nn_bipc_create_cold_1();
  }
  else {
    unaff_R15 = (nn_aipc *)&pnVar3[1].shutdown_fn;
    nn_epbase_init((nn_epbase *)unaff_R15,&nn_bipc_epbase_vfptr,hint);
    ctx = nn_epbase_getctx((nn_epbase *)unaff_R15);
    nn_fsm_init_root(pnVar3,nn_bipc_handler,nn_bipc_shutdown,ctx);
    *(undefined4 *)&pnVar3[1].fn = 1;
    local_28 = (nn_fsm_fn)0x4;
    in_RCX = (nn_aipc *)(local_30 + 4);
    iVar1 = 0;
    pnVar11 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,6,in_RCX,(size_t *)&local_28);
    if (local_28 != (nn_fsm_fn)0x4) goto LAB_0012a2de;
    in_RCX = (nn_aipc *)local_30;
    iVar1 = 0;
    pnVar11 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,7,in_RCX,(size_t *)&local_28);
    if (local_28 == (nn_fsm_fn)0x4) {
      if (local_30._0_4_ == 0) {
        local_30._0_4_ = local_30._4_4_;
      }
      nn_backoff_init((nn_backoff *)&pnVar3[8].stopped.src,3,local_30._4_4_,local_30._0_4_,pnVar3);
      nn_usock_init((nn_usock *)&pnVar3[1].srcptr,1,pnVar3);
      pnVar3[8].owner = (nn_fsm *)0x0;
      nn_list_init((nn_list *)&pnVar3[8].ctx);
      nn_fsm_start(pnVar3);
      *epbase = (nn_epbase *)unaff_R15;
      return 0;
    }
  }
  nn_bipc_create_cold_2();
  uVar2 = pnVar11->state - 1;
  puVar8 = (uint *)in_RCX;
  if (uVar2 < 9) {
    puVar8 = &switchD_0012a310::switchdataD_00134fd4;
    uVar9 = extraout_EDX;
    switch(pnVar11->state) {
    case 1:
      if (iVar1 == -2) {
        if (extraout_EDX == 0xfffffffe) goto LAB_0012a339;
        nn_bipc_handler_cold_11();
        uVar9 = extraout_EDX_00;
        goto switchD_0012a310_caseD_9;
      }
LAB_0012a466:
      nn_bipc_handler_cold_10();
      break;
    case 2:
      unaff_R15 = pnVar11->aipc;
      if (unaff_R15 == in_RCX) {
        uVar2 = extraout_EDX;
        if (extraout_EDX == 0x85b7) {
          pnVar4 = nn_list_end(&pnVar11->aipcs);
          nn_list_insert(&pnVar11->aipcs,&unaff_R15->item,pnVar4);
          pnVar11->aipc = (nn_aipc *)0x0;
          nn_bipc_start_accepting(pnVar11);
          return extraout_EAX_03;
        }
        goto LAB_0012a489;
      }
      if (iVar1 != 2) {
        nn_bipc_handler_cold_7();
        goto LAB_0012a44b;
      }
      if (extraout_EDX == 0x85b9) {
        nn_list_erase(&pnVar11->aipcs,&in_RCX->item);
        nn_aipc_term(in_RCX);
        nn_free(in_RCX);
        return extraout_EAX_04;
      }
      uVar2 = 2;
      if (extraout_EDX == 0x85b8) {
        nn_aipc_stop(in_RCX);
        return extraout_EAX_02;
      }
      goto LAB_0012a492;
    default:
      goto switchD_0012a310_caseD_3;
    case 7:
      if (iVar1 != 3) goto LAB_0012a454;
      if (extraout_EDX == 1) {
        nn_backoff_stop(&pnVar11->retry);
        pnVar11->state = 9;
        return extraout_EAX_00;
      }
      goto LAB_0012a476;
    case 8:
      if (iVar1 != 1) goto LAB_0012a45d;
      if (extraout_EDX == 8) {
        return (&switchD_0012a310::switchdataD_00134fd4)[uVar2] + 0x134fd4;
      }
      if (extraout_EDX == 7) {
        nn_backoff_start(&pnVar11->retry);
        pnVar11->state = 7;
        return extraout_EAX_01;
      }
      goto LAB_0012a482;
    case 9:
switchD_0012a310_caseD_9:
      if (iVar1 != 3) {
LAB_0012a44b:
        nn_bipc_handler_cold_1();
LAB_0012a454:
        nn_bipc_handler_cold_3();
LAB_0012a45d:
        nn_bipc_handler_cold_5();
        goto LAB_0012a466;
      }
      if (uVar9 == 2) {
LAB_0012a339:
        nn_bipc_start_listening(pnVar11);
        return extraout_EAX;
      }
    }
    nn_bipc_handler_cold_2();
LAB_0012a476:
    nn_bipc_handler_cold_4();
  }
switchD_0012a310_caseD_3:
  nn_bipc_handler_cold_12();
LAB_0012a482:
  nn_bipc_handler_cold_6();
  uVar2 = extraout_EDX_01;
LAB_0012a489:
  nn_bipc_handler_cold_9();
  uVar9 = extraout_EDX_02;
LAB_0012a492:
  pnVar3 = (nn_fsm *)(ulong)uVar9;
  nn_bipc_handler_cold_8();
  if (extraout_EDX_03 == -3 && uVar2 == 0xfffffffe) {
LAB_0012a4d8:
    nn_backoff_stop((nn_backoff *)&pnVar3[8].stopped.src);
    if ((nn_aipc *)pnVar3[8].owner != (nn_aipc *)0x0) {
      nn_aipc_stop((nn_aipc *)pnVar3[8].owner);
      *(undefined4 *)&pnVar3[1].fn = 3;
LAB_0012a504:
      iVar1 = nn_aipc_isidle((nn_aipc *)pnVar3[8].owner);
      if (iVar1 == 0) {
        return 0;
      }
      nn_aipc_term((nn_aipc *)pnVar3[8].owner);
      nn_free(pnVar3[8].owner);
      pnVar3[8].owner = (nn_fsm *)0x0;
      nn_usock_stop((nn_usock *)&pnVar3[1].srcptr);
    }
    *(undefined4 *)&pnVar3[1].fn = 4;
  }
  else {
    uVar9 = *(uint *)&pnVar3[1].fn;
    pnVar11 = (nn_bipc *)(ulong)uVar9;
    if (uVar9 == 5) {
      if ((uVar2 == 2) && (extraout_EDX_03 == 0x85b9)) {
        nn_list_erase((nn_list *)&pnVar3[8].ctx,&((nn_aipc *)puVar8)->item);
        nn_aipc_term((nn_aipc *)puVar8);
        nn_free(puVar8);
        goto LAB_0012a5f3;
      }
      nn_bipc_shutdown_cold_1();
      pnStack_98 = pnVar3;
      pnStack_90 = (nn_aipc *)puVar8;
      pnStack_88 = unaff_R15;
      __s = nn_epbase_getaddr(&pnVar11->epbase);
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      sVar6 = strlen(__s);
      if (0x6b < sVar6) {
        nn_bipc_start_listening_cold_4();
        goto LAB_0012a793;
      }
      asStack_118[0].sa_family = 1;
      strncpy(asStack_118[0].sa_data,__s,0x6c);
      uVar2 = socket(1,1,0);
      if ((int)uVar2 < 0) {
LAB_0012a71d:
        self = &pnVar11->usock;
        iVar1 = nn_usock_start(self,1,1,0);
        if (-1 < iVar1) {
          iVar1 = nn_usock_bind(self,(sockaddr *)asStack_118,0x6e);
          if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self,10), -1 < iVar1)) {
            nn_bipc_start_accepting(pnVar11);
            pnVar11->state = 2;
            return extraout_EAX_06;
          }
          nn_usock_stop(self);
          pnVar11->state = 8;
          return extraout_EAX_07;
        }
LAB_0012a793:
        nn_backoff_start(&pnVar11->retry);
        pnVar11->state = 7;
        return extraout_EAX_08;
      }
      iVar1 = fcntl(uVar2,4,0x800);
      if (iVar1 == -1) {
        puVar8 = (uint *)__errno_location();
        pnVar3 = (nn_fsm *)(ulong)*puVar8;
        if (*puVar8 == 0x16) goto LAB_0012a6d3;
      }
      else {
LAB_0012a6d3:
        iVar1 = connect(uVar2,asStack_118,0x6e);
        if ((((iVar1 == -1) && (puVar8 = (uint *)__errno_location(), *puVar8 == 0x6f)) &&
            (iVar1 = unlink(__s), iVar1 != 0)) && (pnVar3 = (nn_fsm *)(ulong)*puVar8, *puVar8 != 2))
        goto LAB_0012a7b5;
        pnVar3 = (nn_fsm *)(ulong)uVar2;
        iVar1 = close(uVar2);
        if (iVar1 == 0) goto LAB_0012a71d;
        nn_bipc_start_listening_cold_3();
      }
      nn_bipc_start_listening_cold_1();
LAB_0012a7b5:
      nn_bipc_start_listening_cold_2();
      if (pnVar3[8].owner == (nn_fsm *)0x0) {
        self_01 = (nn_fsm *)0x740;
        pnVar7 = (nn_aipc *)nn_alloc_(0x740);
        pnVar3[8].owner = (nn_fsm *)pnVar7;
        if (pnVar7 != (nn_aipc *)0x0) {
          nn_aipc_init(pnVar7,2,(nn_epbase *)&pnVar3[1].shutdown_fn,pnVar3);
          nn_aipc_start((nn_aipc *)pnVar3[8].owner,(nn_usock *)&pnVar3[1].srcptr);
          return extraout_EAX_09;
        }
      }
      else {
        nn_bipc_start_accepting_cold_1();
        self_01 = pnVar3;
      }
      nn_bipc_start_accepting_cold_2();
      if (self_01 != (nn_fsm *)0x0) {
        self_01 = (nn_fsm *)&self_01[-2].stopped.item;
      }
      nn_fsm_stop(self_01);
      return extraout_EAX_10;
    }
    if (uVar9 == 3) goto LAB_0012a504;
    if (uVar9 != 4) {
      nn_bipc_shutdown_cold_2();
      goto LAB_0012a4d8;
    }
  }
  iVar1 = nn_usock_isidle((nn_usock *)&pnVar3[1].srcptr);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar3[8].stopped.src);
  if (iVar1 == 0) {
    return 0;
  }
  self_00 = &pnVar3[8].ctx;
  for (pnVar4 = nn_list_begin((nn_list *)self_00); pnVar5 = nn_list_end((nn_list *)self_00),
      pnVar4 != pnVar5; pnVar4 = nn_list_next((nn_list *)self_00,pnVar4)) {
    pnVar7 = (nn_aipc *)(pnVar4 + -0x73);
    if (pnVar4 == (nn_list_item *)0x0) {
      pnVar7 = (nn_aipc *)0x0;
    }
    nn_aipc_stop(pnVar7);
  }
  *(undefined4 *)&pnVar3[1].fn = 5;
LAB_0012a5f3:
  iVar1 = nn_list_empty((nn_list *)&pnVar3[8].ctx);
  if (iVar1 == 0) {
    return 0;
  }
  *(undefined4 *)&pnVar3[1].fn = 1;
  nn_fsm_stopped_noevent(pnVar3);
  nn_epbase_stopped((nn_epbase *)&pnVar3[1].shutdown_fn);
  return extraout_EAX_05;
}

Assistant:

int nn_bipc_create (void *hint, struct nn_epbase **epbase)
{
    struct nn_bipc *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);

    /*  Initialise the structure. */
    nn_epbase_init (&self->epbase, &nn_bipc_epbase_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_epbase_getctx (&self->epbase));
    self->state = NN_BIPC_STATE_IDLE;
    sz = sizeof (reconnect_ivl);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL,
        &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_BIPC_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Return the base class as an out parameter. */
    *epbase = &self->epbase;

    return 0;
}